

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::SparseNode::SharedCtor(SparseNode *this)

{
  this->value_ = 0.0;
  this->index_ = 0;
  this->_cached_size_ = 0;
  return;
}

Assistant:

void SparseNode::SharedCtor() {
  ::memset(&value_, 0, reinterpret_cast<char*>(&index_) -
    reinterpret_cast<char*>(&value_) + sizeof(index_));
  _cached_size_ = 0;
}